

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_hash_policy_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::NodeTest_ConstructDestroy_Test::TestBody
          (NodeTest_ConstructDestroy_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_58;
  Message local_50 [3];
  int local_34;
  int local_30;
  PointeeMatcher<int> local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  NodeTest_ConstructDestroy_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x2a;
  hash_policy_traits<phmap::priv::(anonymous_namespace)::Policy,void>::
  construct<std::allocator<int>,int>
            ((allocator<int> *)&(this->super_NodeTest).field_0x10,&(this->super_NodeTest).a,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_34 = 0x2a;
  local_30 = (int)testing::Pointee<int>(&local_34);
  local_2c.matcher_ =
       (int)testing::internal::
            MakePredicateFormatterFromMatcher<testing::internal::PointeeMatcher<int>>
                      ((PointeeMatcher<int>)local_30);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::PointeeMatcher<int>>::
  operator()((AssertionResult *)local_28,(char *)&local_2c,(int **)0x181a57);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/node_hash_policy_test.cc"
               ,0x34,message);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  hash_policy_traits<phmap::priv::(anonymous_namespace)::Policy,void>::destroy<std::allocator<int>>
            ((allocator<int> *)&(this->super_NodeTest).field_0x10,&(this->super_NodeTest).a);
  return;
}

Assistant:

TEST_F(NodeTest, ConstructDestroy) {
  NodePolicy::construct(&alloc, &a, 42);
  EXPECT_THAT(a, Pointee(42));
  NodePolicy::destroy(&alloc, &a);
}